

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitStructRMW
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,StructRMW *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::ModuleRunner> *pEVar2;
  element_type *peVar3;
  Literal *this_00;
  Literal *pLVar4;
  Literal local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  undefined1 local_108 [8];
  Literal newVal;
  Literal oldVal;
  Literal *field;
  shared_ptr<wasm::GCData> data;
  Flow value;
  undefined1 local_68 [8];
  Flow ref;
  StructRMW *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_68,pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar2 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
          pEVar2,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x20));
    bVar1 = Flow::breaking((Flow *)&data.
                                    super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,
                 (Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
    }
    else {
      Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::getGCData();
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&field);
      if (!bVar1) {
        (*this->_vptr_ExpressionRunner[2])(this,"null ref");
      }
      peVar3 = std::__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<wasm::GCData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&field);
      this_00 = SmallVector<wasm::Literal,_1UL>::operator[]
                          (&(peVar3->values).super_SmallVector<wasm::Literal,_1UL>,
                           (ulong)*(uint *)(ref.breakTo.super_IString.str._M_str + 0x14));
      ::wasm::Literal::Literal((Literal *)&newVal.type,this_00);
      pLVar4 = Flow::getSingleValue
                         ((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
      ::wasm::Literal::Literal((Literal *)local_108,pLVar4);
      switch(*(undefined4 *)(ref.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
        ::wasm::Literal::add(&local_120);
        ::wasm::Literal::operator=(this_00,&local_120);
        ::wasm::Literal::~Literal(&local_120);
        break;
      case 1:
        ::wasm::Literal::sub(&local_138);
        ::wasm::Literal::operator=(this_00,&local_138);
        ::wasm::Literal::~Literal(&local_138);
        break;
      case 2:
        ::wasm::Literal::and_(&local_150);
        ::wasm::Literal::operator=(this_00,&local_150);
        ::wasm::Literal::~Literal(&local_150);
        break;
      case 3:
        ::wasm::Literal::or_(&local_168);
        ::wasm::Literal::operator=(this_00,&local_168);
        ::wasm::Literal::~Literal(&local_168);
        break;
      case 4:
        ::wasm::Literal::xor_(&local_180);
        ::wasm::Literal::operator=(this_00,&local_180);
        ::wasm::Literal::~Literal(&local_180);
        break;
      case 5:
        ::wasm::Literal::operator=(this_00,(Literal *)local_108);
      }
      ::wasm::Literal::Literal(&local_198,(Literal *)&newVal.type);
      Flow::Flow(__return_storage_ptr__,&local_198);
      ::wasm::Literal::~Literal(&local_198);
      ::wasm::Literal::~Literal((Literal *)local_108);
      ::wasm::Literal::~Literal((Literal *)&newVal.type);
      std::shared_ptr<wasm::GCData>::~shared_ptr((shared_ptr<wasm::GCData> *)&field);
    }
    Flow::~Flow((Flow *)&data.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitStructRMW(StructRMW* curr) {
    NOTE_ENTER("StructRMW");
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return ref;
    }
    Flow value = self()->visit(curr->value);
    if (value.breaking()) {
      return value;
    }
    auto data = ref.getSingleValue().getGCData();
    if (!data) {
      trap("null ref");
    }
    auto& field = data->values[curr->index];
    auto oldVal = field;
    auto newVal = value.getSingleValue();
    switch (curr->op) {
      case RMWAdd:
        field = field.add(newVal);
        break;
      case RMWSub:
        field = field.sub(newVal);
        break;
      case RMWAnd:
        field = field.and_(newVal);
        break;
      case RMWOr:
        field = field.or_(newVal);
        break;
      case RMWXor:
        field = field.xor_(newVal);
        break;
      case RMWXchg:
        field = newVal;
        break;
    }
    return oldVal;
  }